

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

Matrix2f __thiscall Matrix3f::getSubmatrix2x2(Matrix3f *this,int i0,int j0)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  int in_ECX;
  undefined4 in_register_00000034;
  bool bVar4;
  long lVar5;
  undefined8 in_XMM1_Qa;
  Matrix2f MVar6;
  
  Matrix2f::Matrix2f((Matrix2f *)this,0.0);
  lVar5 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    fVar1 = *(float *)(CONCAT44(in_register_00000034,i0) + ((long)in_ECX * 3 + lVar5 + j0) * 4);
    pfVar3 = Matrix2f::operator()((Matrix2f *)this,(int)lVar5,0);
    *pfVar3 = fVar1;
    fVar1 = *(float *)(CONCAT44(in_register_00000034,i0) + (lVar5 + j0 + (long)in_ECX * 3 + 3) * 4);
    pfVar3 = Matrix2f::operator()((Matrix2f *)this,(int)lVar5,1);
    lVar5 = 1;
    *pfVar3 = fVar1;
    bVar2 = false;
  } while (bVar4);
  MVar6.m_elements[1] = 0.0;
  MVar6.m_elements[0] = fVar1;
  MVar6.m_elements[2] = (float)(int)in_XMM1_Qa;
  MVar6.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Matrix2f)MVar6.m_elements;
}

Assistant:

Matrix2f Matrix3f::getSubmatrix2x2( int i0, int j0 ) const
{
	Matrix2f out;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			out( i, j ) = ( *this )( i + i0, j + j0 );
		}
	}

	return out;
}